

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::sr::anon_unknown_0::LinearDerivateCase::createInstance
          (LinearDerivateCase *this,Context *context)

{
  TriangleDerivateCaseInstance *this_00;
  
  this_00 = (TriangleDerivateCaseInstance *)operator_new(0x220);
  TriangleDerivateCaseInstance::TriangleDerivateCaseInstance
            (this_00,context,
             (this->super_TriangleDerivateCase).super_ShaderRenderCase.m_uniformSetup.
             super_UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
             .m_data.ptr,&(this->super_TriangleDerivateCase).m_definitions,
             &(this->super_TriangleDerivateCase).m_values);
  (this_00->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_00bff030;
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* LinearDerivateCase::createInstance (Context& context) const
{
	DE_ASSERT(m_uniformSetup != DE_NULL);
	return new LinearDerivateCaseInstance(context, *m_uniformSetup, m_definitions, m_values);
}